

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O2

void __thiscall
rtripflagProblems_rtripflagFiles_Test::~rtripflagProblems_rtripflagFiles_Test
          (rtripflagProblems_rtripflagFiles_Test *this)

{
  ~rtripflagProblems_rtripflagFiles_Test
            ((rtripflagProblems_rtripflagFiles_Test *)
             &this[-1].super_rtripflagProblems.super_TestWithParam<int>.super_Test.gtest_flag_saver_
            );
  return;
}

Assistant:

TEST_P(rtripflagProblems, rtripflagFiles)
{
    auto cdata = loadFailureFile("rtrip_flag", GetParam());
    if (cdata.size() <= 4) {
        return;
    }
    std::string test1 = cdata.substr(4);
    std::uint32_t flags;
    std::memcpy(&flags, cdata.data(), 4);
    auto u1 = unit_from_string(test1, flags);
    if (!is_error(u1)) {
        auto str = to_string(u1);
        auto u2 = unit_from_string(str);
        EXPECT_FALSE(is_error(u2));
        if (u2 == u1) {
            EXPECT_EQ(u2, u1);
            EXPECT_EQ(unit_cast(u2), unit_cast(u1));
            EXPECT_FALSE(units::unit_cast(u2) != units::unit_cast(u1));
        } else if (!is_error(root(u2, 2))) {
            EXPECT_EQ(root(unit_cast(u2), 2), root(unit_cast(u1), 2));
            EXPECT_FALSE(
                root(units::unit_cast(u2), 2) != root(units::unit_cast(u1), 2));
        } else if (!is_error(root(u2, 3))) {
            EXPECT_EQ(root(unit_cast(u2), 3), root(unit_cast(u1), 3));
            EXPECT_FALSE(
                root(units::unit_cast(u2), 3) != root(units::unit_cast(u1), 3));
        } else {
            EXPECT_TRUE(unit_cast(u2) == unit_cast(u1));
            EXPECT_FALSE(units::unit_cast(u2) != units::unit_cast(u1));
        }
    }
}